

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void arm_rebuild_hflags_arm(CPUARMState *env)

{
  int el;
  ARMMMUIdx fp_el;
  uint32_t uVar1;
  ARMMMUIdx in_ECX;
  ARMMMUIdx mmu_idx;
  
  el = arm_current_el(env);
  fp_el = arm_mmu_idx_el_arm(env,el);
  if (env->aarch64 == 0) {
    if ((env->features & 0x200) == 0) {
      uVar1 = rebuild_hflags_a32(env,fp_el,mmu_idx);
    }
    else {
      uVar1 = rebuild_hflags_m32(env,fp_el,mmu_idx);
    }
  }
  else {
    uVar1 = rebuild_hflags_a64(env,el,fp_el,in_ECX);
  }
  env->hflags = uVar1;
  return;
}

Assistant:

void arm_rebuild_hflags(CPUARMState *env)
{
    env->hflags = rebuild_hflags_internal(env);
}